

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void ptrmapPut(BtShared *pBt,Pgno key,u8 eType,Pgno parent,int *pRC)

{
  long lVar1;
  Pgno PVar2;
  int iVar3;
  u32 uVar4;
  char *pcVar5;
  void *pvVar6;
  u32 in_ECX;
  char in_DL;
  Pgno in_ESI;
  BtShared *in_RDI;
  Pager *in_R8;
  long in_FS_OFFSET;
  int rc;
  int offset;
  Pgno iPtrmap;
  u8 *pPtrmap;
  DbPage *pDbPage;
  undefined4 in_stack_ffffffffffffffb8;
  int iVar7;
  undefined4 uVar8;
  Pgno pgno;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  pgno = 0xaaaaaaaa;
  uVar8 = 0xaaaaaaaa;
  iVar7 = -0x55555556;
  if (*(int *)&in_R8->pVfs == 0) {
    if (in_ESI == 0) {
      iVar7 = sqlite3CorruptError(0);
      *(int *)&in_R8->pVfs = iVar7;
    }
    else {
      PVar2 = ptrmapPageno(in_RDI,in_ESI);
      iVar7 = sqlite3PagerGet(in_R8,pgno,(DbPage **)CONCAT44(PVar2,uVar8),iVar7);
      if (iVar7 == 0) {
        pcVar5 = (char *)sqlite3PagerGetExtra((DbPage *)&DAT_aaaaaaaaaaaaaaaa);
        if (*pcVar5 == '\0') {
          iVar3 = ((in_ESI - PVar2) + -1) * 5;
          if (iVar3 < 0) {
            iVar7 = sqlite3CorruptError(0);
            *(int *)&in_R8->pVfs = iVar7;
          }
          else {
            pvVar6 = sqlite3PagerGetData((DbPage *)&DAT_aaaaaaaaaaaaaaaa);
            if ((in_DL != *(char *)((long)pvVar6 + (long)iVar3)) ||
               (uVar4 = sqlite3Get4byte((u8 *)((long)pvVar6 + (long)(iVar3 + 1))), uVar4 != in_ECX))
            {
              iVar7 = sqlite3PagerWrite((PgHdr *)CONCAT44(iVar7,in_stack_ffffffffffffffb8));
              *(int *)&in_R8->pVfs = iVar7;
              if (iVar7 == 0) {
                *(char *)((long)pvVar6 + (long)iVar3) = in_DL;
                sqlite3Put4byte((uchar *)((long)pvVar6 + (long)(iVar3 + 1)),in_ECX);
              }
            }
          }
        }
        else {
          iVar7 = sqlite3CorruptError(0);
          *(int *)&in_R8->pVfs = iVar7;
        }
        sqlite3PagerUnref((DbPage *)0x16ec17);
      }
      else {
        *(int *)&in_R8->pVfs = iVar7;
      }
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

static void ptrmapPut(BtShared *pBt, Pgno key, u8 eType, Pgno parent, int *pRC){
  DbPage *pDbPage;  /* The pointer map page */
  u8 *pPtrmap;      /* The pointer map data */
  Pgno iPtrmap;     /* The pointer map page number */
  int offset;       /* Offset in pointer map page */
  int rc;           /* Return code from subfunctions */

  if( *pRC ) return;

  assert( sqlite3_mutex_held(pBt->mutex) );
  /* The super-journal page number must never be used as a pointer map page */
  assert( 0==PTRMAP_ISPAGE(pBt, PENDING_BYTE_PAGE(pBt)) );

  assert( pBt->autoVacuum );
  if( key==0 ){
    *pRC = SQLITE_CORRUPT_BKPT;
    return;
  }
  iPtrmap = PTRMAP_PAGENO(pBt, key);
  rc = sqlite3PagerGet(pBt->pPager, iPtrmap, &pDbPage, 0);
  if( rc!=SQLITE_OK ){
    *pRC = rc;
    return;
  }
  if( ((char*)sqlite3PagerGetExtra(pDbPage))[0]!=0 ){
    /* The first byte of the extra data is the MemPage.isInit byte.
    ** If that byte is set, it means this page is also being used
    ** as a btree page. */
    *pRC = SQLITE_CORRUPT_BKPT;
    goto ptrmap_exit;
  }
  offset = PTRMAP_PTROFFSET(iPtrmap, key);
  if( offset<0 ){
    *pRC = SQLITE_CORRUPT_BKPT;
    goto ptrmap_exit;
  }
  assert( offset <= (int)pBt->usableSize-5 );
  pPtrmap = (u8 *)sqlite3PagerGetData(pDbPage);

  if( eType!=pPtrmap[offset] || get4byte(&pPtrmap[offset+1])!=parent ){
    TRACE(("PTRMAP_UPDATE: %u->(%u,%u)\n", key, eType, parent));
    *pRC= rc = sqlite3PagerWrite(pDbPage);
    if( rc==SQLITE_OK ){
      pPtrmap[offset] = eType;
      put4byte(&pPtrmap[offset+1], parent);
    }
  }

ptrmap_exit:
  sqlite3PagerUnref(pDbPage);
}